

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O0

Light * embree::ISPCScene::createLight(Ref<embree::SceneGraph::LightNode> *in)

{
  undefined4 uVar1;
  runtime_error *this;
  undefined8 *in_RDI;
  Light *local_10;
  
  uVar1 = (**(code **)(*(long *)*in_RDI + 0x78))();
  switch(uVar1) {
  case 0:
    local_10 = (Light *)AmbientLight_create();
    break;
  case 1:
    local_10 = (Light *)PointLight_create();
    break;
  case 2:
    local_10 = (Light *)DirectionalLight_create();
    break;
  case 3:
    local_10 = (Light *)0x0;
    break;
  case 4:
    local_10 = (Light *)DirectionalLight_create();
    break;
  case 5:
    local_10 = (Light *)0x0;
    break;
  case 6:
    local_10 = (Light *)0x0;
    break;
  default:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"unknown light type");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_10;
}

Assistant:

Light* ISPCScene::createLight(Ref<SceneGraph::LightNode> in)
  {
    switch (in->getType()) {
    case SceneGraph::LIGHT_AMBIENT    : return (Light*) AmbientLight_create();
    case SceneGraph::LIGHT_DIRECTIONAL: return (Light*) DirectionalLight_create();
    case SceneGraph::LIGHT_DISTANT    : return (Light*) DirectionalLight_create();
    case SceneGraph::LIGHT_POINT      : return (Light*) PointLight_create();
    case SceneGraph::LIGHT_SPOT       : return nullptr;
    case SceneGraph::LIGHT_TRIANGLE   : return nullptr;
    case SceneGraph::LIGHT_QUAD       : return nullptr;
    default                           : THROW_RUNTIME_ERROR("unknown light type");
    }
    return nullptr;
  }